

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsl_types.h
# Opt level: O3

void __thiscall
parcel_out_uniform_storage::handle_images
          (parcel_out_uniform_storage *this,glsl_type *base_type,gl_uniform_storage *uniform,
          char *name)

{
  byte bVar1;
  gl_program *pgVar2;
  GLenum GVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  GLenum *pGVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  GLenum16 GVar12;
  long lVar13;
  GLenum GVar14;
  bool bVar15;
  int iVar18;
  undefined1 auVar16 [16];
  int iVar19;
  undefined1 auVar17 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int iVar27;
  int iVar33;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  int iVar34;
  int iVar36;
  undefined1 auVar35 [16];
  undefined1 in_XMM11 [16];
  undefined1 auVar37 [16];
  undefined1 in_XMM12 [16];
  undefined1 auVar38 [16];
  
  if (base_type->field_0x4 == '\r') {
    uniform->opaque[this->shader_type].active = true;
    uVar9 = *(uint *)&(this->current_var->data).field_0x4;
    bVar15 = (uVar9 >> 0xb & 1) != 0;
    GVar14 = 35000;
    if (bVar15) {
      GVar14 = 0;
    }
    GVar3 = 0x88ba - bVar15;
    if ((uVar9 >> 10 & 1) != 0) {
      GVar3 = GVar14;
    }
    if (((this->current_var->data).field_0x6 & 4) == 0) {
      bVar15 = set_opaque_indices(this,base_type,uniform,name,&this->next_image,
                                  this->record_next_image);
      auVar20 = _DAT_00228040;
      auVar17 = _DAT_00228030;
      auVar6 = _DAT_00225aa0;
      auVar5 = _DAT_002001c0;
      auVar4 = _DAT_002001b0;
      if (bVar15) {
        bVar1 = uniform->opaque[this->shader_type].index;
        uVar8 = (ulong)bVar1;
        uVar9 = 0x20;
        if (this->next_image < 0x20) {
          uVar9 = this->next_image;
        }
        if (bVar1 < uVar9) {
          pgVar2 = this->prog->_LinkedShaders[this->shader_type]->Program;
          lVar10 = (uVar9 - uVar8) + -1;
          auVar16._8_4_ = (int)lVar10;
          auVar16._0_8_ = lVar10;
          auVar16._12_4_ = (int)((ulong)lVar10 >> 0x20);
          uVar11 = 0;
          auVar16 = auVar16 ^ _DAT_002001c0;
          auVar21._8_4_ = 0xffffffff;
          auVar21._0_8_ = 0xffffffffffffffff;
          auVar21._12_4_ = 0xffffffff;
          do {
            auVar22._8_4_ = (int)uVar11;
            auVar22._0_8_ = uVar11;
            auVar22._12_4_ = (int)(uVar11 >> 0x20);
            auVar23 = (auVar22 | auVar4) ^ auVar5;
            iVar27 = auVar16._0_4_;
            iVar34 = -(uint)(iVar27 < auVar23._0_4_);
            iVar18 = auVar16._4_4_;
            auVar24._4_4_ = -(uint)(iVar18 < auVar23._4_4_);
            iVar33 = auVar16._8_4_;
            iVar36 = -(uint)(iVar33 < auVar23._8_4_);
            iVar19 = auVar16._12_4_;
            auVar24._12_4_ = -(uint)(iVar19 < auVar23._12_4_);
            auVar30._4_4_ = iVar34;
            auVar30._0_4_ = iVar34;
            auVar30._8_4_ = iVar36;
            auVar30._12_4_ = iVar36;
            auVar37 = pshuflw(in_XMM11,auVar30,0xe8);
            auVar28._4_4_ = -(uint)(auVar23._4_4_ == iVar18);
            auVar28._12_4_ = -(uint)(auVar23._12_4_ == iVar19);
            auVar28._0_4_ = auVar28._4_4_;
            auVar28._8_4_ = auVar28._12_4_;
            auVar38 = pshuflw(in_XMM12,auVar28,0xe8);
            auVar24._0_4_ = auVar24._4_4_;
            auVar24._8_4_ = auVar24._12_4_;
            auVar23 = pshuflw(auVar37,auVar24,0xe8);
            auVar23 = (auVar23 | auVar38 & auVar37) ^ auVar21;
            auVar23 = packssdw(auVar23,auVar23);
            GVar12 = (GLenum16)GVar3;
            if ((auVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              (pgVar2->field_20).sh.ImageAccess[uVar8 + uVar11] = GVar12;
            }
            auVar24 = auVar28 & auVar30 | auVar24;
            auVar23 = packssdw(auVar24,auVar24);
            auVar23 = packssdw(auVar23 ^ auVar21,auVar23 ^ auVar21);
            if ((auVar23._0_4_ >> 0x10 & 1) != 0) {
              (pgVar2->field_20).sh.ImageAccess[uVar8 + uVar11 + 1] = GVar12;
            }
            auVar28 = (auVar22 | auVar6) ^ auVar5;
            iVar34 = -(uint)(iVar27 < auVar28._0_4_);
            auVar35._4_4_ = -(uint)(iVar18 < auVar28._4_4_);
            iVar36 = -(uint)(iVar33 < auVar28._8_4_);
            auVar35._12_4_ = -(uint)(iVar19 < auVar28._12_4_);
            auVar23._4_4_ = iVar34;
            auVar23._0_4_ = iVar34;
            auVar23._8_4_ = iVar36;
            auVar23._12_4_ = iVar36;
            auVar29._4_4_ = -(uint)(auVar28._4_4_ == iVar18);
            auVar29._12_4_ = -(uint)(auVar28._12_4_ == iVar19);
            auVar29._0_4_ = auVar29._4_4_;
            auVar29._8_4_ = auVar29._12_4_;
            auVar35._0_4_ = auVar35._4_4_;
            auVar35._8_4_ = auVar35._12_4_;
            auVar28 = auVar29 & auVar23 | auVar35;
            auVar28 = packssdw(auVar28,auVar28);
            auVar28 = packssdw(auVar28 ^ auVar21,auVar28 ^ auVar21);
            if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              (pgVar2->field_20).sh.ImageAccess[uVar8 + uVar11 + 2] = GVar12;
            }
            auVar23 = pshufhw(auVar23,auVar23,0x84);
            auVar30 = pshufhw(auVar29,auVar29,0x84);
            auVar24 = pshufhw(auVar23,auVar35,0x84);
            auVar23 = (auVar24 | auVar30 & auVar23) ^ auVar21;
            auVar23 = packssdw(auVar23,auVar23);
            if ((auVar23 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              (pgVar2->field_20).sh.ImageAccess[uVar8 + uVar11 + 3] = GVar12;
            }
            auVar23 = (auVar22 | auVar20) ^ auVar5;
            iVar34 = -(uint)(iVar27 < auVar23._0_4_);
            auVar26._4_4_ = -(uint)(iVar18 < auVar23._4_4_);
            iVar36 = -(uint)(iVar33 < auVar23._8_4_);
            auVar26._12_4_ = -(uint)(iVar19 < auVar23._12_4_);
            auVar31._4_4_ = iVar34;
            auVar31._0_4_ = iVar34;
            auVar31._8_4_ = iVar36;
            auVar31._12_4_ = iVar36;
            auVar28 = pshuflw(auVar28,auVar31,0xe8);
            auVar25._4_4_ = -(uint)(auVar23._4_4_ == iVar18);
            auVar25._12_4_ = -(uint)(auVar23._12_4_ == iVar19);
            auVar25._0_4_ = auVar25._4_4_;
            auVar25._8_4_ = auVar25._12_4_;
            in_XMM12 = pshuflw(auVar38 & auVar37,auVar25,0xe8);
            in_XMM12 = in_XMM12 & auVar28;
            auVar26._0_4_ = auVar26._4_4_;
            auVar26._8_4_ = auVar26._12_4_;
            auVar23 = pshuflw(auVar28,auVar26,0xe8);
            auVar23 = (auVar23 | in_XMM12) ^ auVar21;
            in_XMM11 = packssdw(auVar23,auVar23);
            if ((in_XMM11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              (pgVar2->field_20).sh.ImageAccess[uVar8 + uVar11 + 4] = GVar12;
            }
            auVar26 = auVar25 & auVar31 | auVar26;
            auVar23 = packssdw(auVar26,auVar26);
            auVar23 = packssdw(auVar23 ^ auVar21,auVar23 ^ auVar21);
            if ((auVar23 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              (pgVar2->field_20).sh.ImageAccess[uVar8 + uVar11 + 5] = GVar12;
            }
            auVar22 = (auVar22 | auVar17) ^ auVar5;
            iVar27 = -(uint)(iVar27 < auVar22._0_4_);
            auVar32._4_4_ = -(uint)(iVar18 < auVar22._4_4_);
            iVar33 = -(uint)(iVar33 < auVar22._8_4_);
            auVar32._12_4_ = -(uint)(iVar19 < auVar22._12_4_);
            auVar38._4_4_ = iVar27;
            auVar38._0_4_ = iVar27;
            auVar38._8_4_ = iVar33;
            auVar38._12_4_ = iVar33;
            auVar37._4_4_ = -(uint)(auVar22._4_4_ == iVar18);
            auVar37._12_4_ = -(uint)(auVar22._12_4_ == iVar19);
            auVar37._0_4_ = auVar37._4_4_;
            auVar37._8_4_ = auVar37._12_4_;
            auVar32._0_4_ = auVar32._4_4_;
            auVar32._8_4_ = auVar32._12_4_;
            auVar22 = auVar37 & auVar38 | auVar32;
            auVar22 = packssdw(auVar22,auVar22);
            auVar22 = packssdw(auVar22 ^ auVar21,auVar22 ^ auVar21);
            if ((auVar22 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              (pgVar2->field_20).sh.ImageAccess[uVar8 + uVar11 + 6] = GVar12;
            }
            auVar23 = pshufhw(auVar38,auVar38,0x84);
            auVar22 = pshufhw(auVar37,auVar37,0x84);
            auVar28 = pshufhw(auVar23,auVar32,0x84);
            auVar22 = packssdw(auVar22 & auVar23,(auVar28 | auVar22 & auVar23) ^ auVar21);
            if ((auVar22 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              (pgVar2->field_20).sh.ImageAccess[uVar8 + uVar11 + 7] = GVar12;
            }
            uVar11 = uVar11 + 8;
          } while (((uVar9 - uVar8) + 7 & 0xfffffffffffffff8) != uVar11);
        }
      }
    }
    else {
      bVar15 = set_opaque_indices(this,base_type,uniform,name,&this->next_bindless_image,
                                  this->record_next_bindless_image);
      if (bVar15) {
        this->num_bindless_images = this->next_bindless_image;
        pGVar7 = (GLenum *)realloc(this->bindless_access,(ulong)this->next_bindless_image << 2);
        this->bindless_access = pGVar7;
        auVar6 = _DAT_00225aa0;
        auVar5 = _DAT_002001c0;
        auVar4 = _DAT_002001b0;
        bVar1 = uniform->opaque[this->shader_type].index;
        uVar8 = (ulong)bVar1;
        if ((uint)bVar1 < this->num_bindless_images) {
          lVar10 = this->num_bindless_images - uVar8;
          lVar13 = lVar10 + -1;
          auVar17._8_4_ = (int)lVar13;
          auVar17._0_8_ = lVar13;
          auVar17._12_4_ = (int)((ulong)lVar13 >> 0x20);
          uVar11 = 0;
          auVar17 = auVar17 ^ _DAT_002001c0;
          do {
            auVar20._8_4_ = (int)uVar11;
            auVar20._0_8_ = uVar11;
            auVar20._12_4_ = (int)(uVar11 >> 0x20);
            auVar16 = (auVar20 | auVar4) ^ auVar5;
            iVar27 = auVar17._4_4_;
            if ((bool)(~(auVar16._4_4_ == iVar27 && auVar17._0_4_ < auVar16._0_4_ ||
                        iVar27 < auVar16._4_4_) & 1)) {
              pGVar7[uVar8 + uVar11] = GVar3;
            }
            if ((auVar16._12_4_ != auVar17._12_4_ || auVar16._8_4_ <= auVar17._8_4_) &&
                auVar16._12_4_ <= auVar17._12_4_) {
              pGVar7[uVar8 + uVar11 + 1] = GVar3;
            }
            auVar20 = (auVar20 | auVar6) ^ auVar5;
            iVar18 = auVar20._4_4_;
            if (iVar18 <= iVar27 && (iVar18 != iVar27 || auVar20._0_4_ <= auVar17._0_4_)) {
              pGVar7[uVar8 + uVar11 + 2] = GVar3;
              pGVar7[uVar8 + uVar11 + 3] = GVar3;
            }
            uVar11 = uVar11 + 4;
          } while ((lVar10 + 3U & 0xfffffffffffffffc) != uVar11);
        }
      }
    }
  }
  return;
}

Assistant:

bool is_image() const
   {
      return base_type == GLSL_TYPE_IMAGE;
   }